

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O3

void test_AString_remove_indexBeyoundBounds_fn(int _i)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator = private_ACUtilsTest_AString_realloc;
  string.deallocator = private_ACUtilsTest_AString_free;
  string.size = 8;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x12275e;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"01234567",9);
  private_ACUtilsTest_AString_reallocFail = 0;
  private_ACUtilsTest_AString_reallocCount = 0;
  uStack_50 = 0x12279a;
  AString_remove(&string,8,1);
  uStack_50 = 0x1227ac;
  AString_remove(&string,0x29a,0x2a);
  if (string.capacity == 8) {
    uStack_50 = 0x1227ca;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x1e6);
    if (string.buffer == (char *)0x0) {
      ppcVar6 = &local_58;
      pcVar4 = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar7 = "(void*) (string).buffer != NULL";
      pcVar8 = "(void*) (string).buffer";
      iVar1 = 0x1e6;
LAB_001229bf:
      uStack_50 = 0;
      local_58 = (char *)0x0;
      *(code **)((long)ppcVar6 + -8) = test_AString_remove_nullptr_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar1,pcVar4,pcVar3,pcVar7,pcVar8);
    }
    uStack_50 = 0x1227e7;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x1e6);
    pcVar8 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar3 = "";
      pcVar8 = "(null)";
    }
    else {
      uStack_50 = 0x122804;
      iVar1 = strcmp("01234567",string.buffer);
      if (iVar1 == 0) {
        uStack_50 = 0x12281d;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x1e6);
        if (string.size == 8) {
          uStack_50 = 0x12283d;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x1e6);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            uStack_50 = 0x12285e;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x1e7);
            uStack_50 = 0x122867;
            (*string.deallocator)(string.buffer);
            return;
          }
          ppcVar6 = &local_68;
          local_60 = "(0)";
          local_68 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar4 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar7 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount";
          iVar1 = 0x1e7;
          goto LAB_001229bf;
        }
        local_60 = "strlen(\"01234567\")";
        pcVar4 = "(string).size == strlen(\"01234567\")";
        pcVar7 = "(string).size";
        pcVar3 = (char *)string.size;
        goto LAB_00122967;
      }
      pcVar3 = "\"";
    }
    expr = 
    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
    ;
    pcVar2 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
    pcVar4 = "(string).buffer == (\"01234567\")";
    pcVar7 = "(string).buffer";
    local_58 = "\"";
    local_60 = "01234567";
    local_68 = "\"";
    pcStack_70 = "(\"01234567\")";
    ppcVar5 = &pcStack_80;
    pcStack_80 = pcVar8;
    pcStack_78 = pcVar3;
  }
  else {
    local_60 = "(8)";
    pcVar4 = "(string).capacity == (8)";
    pcVar7 = "(string).capacity";
    pcVar3 = (char *)string.capacity;
LAB_00122967:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    local_58 = (char *)0x8;
    ppcVar5 = &local_60;
  }
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar3;
  *(undefined8 *)((long)ppcVar5 + -0x10) = 0x12297b;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x1e6,expr,pcVar2,pcVar4,pcVar7);
}

Assistant:

static struct AString private_ACUtilsTest_AString_constructTestString(const char *initBuffer, size_t capacity)
{
    bool tmp = private_ACUtilsTest_AString_reallocFail;
    struct AString string = {private_ACUtilsTest_AString_realloc, private_ACUtilsTest_AString_free};
    string.size = strlen(initBuffer);
    string.capacity = capacity;
    private_ACUtilsTest_AString_reallocFail = false;
    string.buffer = (char*) string.reallocator(nullptr, string.capacity + 1);
    private_ACUtilsTest_AString_reallocFail = tmp;
    private_ACUtilsTest_AString_reallocCount = 0;
    private_ACUtilsTest_AString_freeCount = 0;
    memcpy(string.buffer, initBuffer, string.size + 1); /* +1 for '\0' */
    return string;
}